

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O1

bool __thiscall QPluginLoader::unload(QPluginLoader *this)

{
  QLibraryPrivate *pQVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->did_load == true) {
    this->did_load = false;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar4 = QLibraryPrivate::unload(this->d,UnloadSys);
      return bVar4;
    }
  }
  else {
    if (this->d != (QLibraryPrivate *)0x0) {
      QMetaObject::tr(&local_38,&staticMetaObject,"The plugin was not loaded.",(char *)0x0,-1);
      pQVar1 = this->d;
      data = &((pQVar1->errorString).d.d)->super_QArrayData;
      pcVar2 = (pQVar1->errorString).d.ptr;
      (pQVar1->errorString).d.d = local_38.d.d;
      (pQVar1->errorString).d.ptr = local_38.d.ptr;
      qVar3 = (pQVar1->errorString).d.size;
      (pQVar1->errorString).d.size = local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = pcVar2;
      local_38.d.size = qVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return false;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QPluginLoader::unload()
{
    if (did_load) {
        did_load = false;
        return d->unload();
    }
    if (d) // Ouch
        d->errorString = tr("The plugin was not loaded.");
    return false;
}